

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

string * XPMP2::GetMiscNetwTimeStr_abi_cxx11_(float _time)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  string *in_RDI;
  undefined8 in_R9;
  float in_XMM0_Da;
  uint runM;
  uint runH;
  char aszTimeStr [20];
  allocator<char> local_31;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  float local_c;
  
  uVar1 = std::isnan((double)(ulong)(uint)in_XMM0_Da);
  local_c = in_XMM0_Da;
  if ((uVar1 & 1) != 0) {
    local_c = GetMiscNetwTime();
  }
  uVar4 = (ulong)(local_c / 3600.0);
  uVar2 = (undefined4)uVar4;
  local_c = local_c - (float)(uVar4 & 0xffffffff) * 3600.0;
  uVar5 = (ulong)(local_c / 60.0);
  uVar3 = (undefined4)uVar5;
  snprintf(&stack0xffffffffffffffd8,0x14,"%u:%02u:%06.3f",
           (double)(local_c - (float)(uVar5 & 0xffffffff) * 60.0),uVar4 & 0xffffffff,
           uVar5 & 0xffffffff,in_R9,&stack0xffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (allocator<char> *)CONCAT44(uVar2,uVar3));
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

std::string GetMiscNetwTimeStr (float _time)
{
    char aszTimeStr[20];
    if (std::isnan(_time))
        _time = GetMiscNetwTime();
    
    const unsigned runH = unsigned(_time / 3600.0f);
    _time -= runH * 3600.0f;
    const unsigned runM = unsigned(_time / 60.0f);
    _time -= runM * 60.0f;
    
    snprintf(aszTimeStr, sizeof(aszTimeStr), "%u:%02u:%06.3f",
             runH, runM, _time);
    return aszTimeStr;
}